

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu2_gen_regs(void *hal,HalTaskInfo *task)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  RK_U32 *p_reg_1;
  int k;
  RK_U32 *p_reg;
  RK_U32 j;
  M2vdVdpu2Reg *p_regs;
  M2VDDxvaParam *dx;
  M2vdHalCtx *ctx;
  MppBuffer framebuf;
  MppBuffer streambuf;
  void *q_table;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  q_table._4_4_ = MPP_OK;
  if ((task->dec).valid != 0) {
    streambuf = (MppBuffer)0x0;
    framebuf = (MppBuffer)0x0;
    ctx = (M2vdHalCtx *)0x0;
    puVar1 = (uint *)(task->dec).syntax.data;
    lVar2 = *(long *)((long)hal + 0x68);
    (task->dec).valid = 0;
    pHStack_18 = task;
    task_local = (HalTaskInfo *)hal;
    streambuf = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu2_gen_regs");
    memcpy(streambuf,*(void **)(puVar1 + 4),0x100);
    mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x78),0,"hal_m2vd_vdpu2_gen_regs");
    hal_m2vd_vdpu2_init_hwcfg((M2vdHalCtx *)hal);
    *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffffffb | 4;
    *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffffffd | 2;
    if (puVar1[8] == 0) {
      *(undefined4 *)(lVar2 + 0xd4) = 6;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfff87fff | (puVar1[0x24] & 0xf) << 0xf
      ;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xffff87ff | (puVar1[0x24] & 0xf) << 0xb
      ;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffff87f | (puVar1[0x26] & 0xf) << 7;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xffffff87 | (puVar1[0x26] & 0xf) << 3;
      if (puVar1[0x23] != 0) {
        *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffffffb;
      }
      if (puVar1[0x25] != 0) {
        *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffffffd;
      }
    }
    else {
      *(undefined4 *)(lVar2 + 0xd4) = 5;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfff87fff | (puVar1[0x23] & 0xf) << 0xf
      ;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xffff87ff | (puVar1[0x24] & 0xf) << 0xb
      ;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfffff87f | (puVar1[0x25] & 0xf) << 7;
      *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xffffff87 | (puVar1[0x26] & 0xf) << 3;
    }
    *(uint *)(lVar2 + 0x1e0) = *(uint *)(lVar2 + 0x1e0) & 0x7fffff | (puVar1[9] + 0xf >> 4) << 0x17;
    *(uint *)(lVar2 + 0x1e0) =
         *(uint *)(lVar2 + 0x1e0) & 0xfff807ff | (puVar1[10] + 0xf >> 4 & 0xff) << 0xb;
    *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffdffff | (1 - puVar1[0x13] & 1) << 0x11;
    if (puVar1[0x32] == 3) {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffeffff;
    }
    else {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffeffff | 0x10000;
      *(uint *)(lVar2 + 0xe4) =
           *(uint *)(lVar2 + 0xe4) & 0xffffdfff | (uint)(puVar1[0x32] == 1) << 0xd;
    }
    if (puVar1[0x20] == 3) {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xffff7fff | 0x8000;
    }
    else {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xffff7fff;
    }
    if (puVar1[0x20] == 1) {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xffffbfff;
    }
    else {
      *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xffffbfff | 0x4000;
    }
    *(uint *)(lVar2 + 0x1e0) = *(uint *)(lVar2 + 0x1e0) & 0xffffffdf | (puVar1[0x33] & 1) << 5;
    *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xffffefff;
    *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffffbff;
    *(uint *)(lVar2 + 0x1e0) = *(uint *)(lVar2 + 0x1e0) & 0xffffffbf | (puVar1[0x38] & 1) << 6;
    *(uint *)(lVar2 + 0x220) = *(uint *)(lVar2 + 0x220) & 0xfff7ffff | (puVar1[0x38] & 1) << 0x13;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0xfeffffff | (puVar1[0x36] & 1) << 0x18;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0xfffffff3 | (puVar1[0x31] & 3) << 2;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0xffffffef | (puVar1[0x35] & 1) << 4;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0xfffffffd | (puVar1[0x37] & 1) << 1;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0xfffffffe | puVar1[0x34] & 1;
    *(uint *)(lVar2 + 0xcc) = *(uint *)(lVar2 + 0xcc) & 0x81ffffff | 0x2000000;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x58),(pHStack_18->dec).input,SLOT_BUFFER,&framebuf);
    iVar3 = mpp_buffer_get_fd_with_caller(framebuf,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0x100) = iVar3;
    if (puVar1[2] != 0) {
      mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x90),0x40,puVar1[2]);
    }
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x60),(uint)((byte)puVar1[6] & 0x7f),SLOT_BUFFER,&ctx);
    if ((puVar1[0x32] == 1) || (puVar1[0x32] == 3)) {
      iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
      *(int *)(lVar2 + 0xfc) = iVar3;
    }
    else {
      iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
      *(int *)(lVar2 + 0xfc) = iVar3;
      mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x90),0x3f,puVar1[9] + 0xf & 0xfffffff0);
    }
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x60),(uint)(*(byte *)((long)puVar1 + 0x19) & 0x7f),
               SLOT_BUFFER,&ctx);
    iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0x20c) = iVar3;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x60),(uint)(*(byte *)((long)puVar1 + 0x1a) & 0x7f),
               SLOT_BUFFER,&ctx);
    iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0x250) = iVar3;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x60),(uint)(*(byte *)((long)puVar1 + 0x1b) & 0x7f),
               SLOT_BUFFER,&ctx);
    iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0x218) = iVar3;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x60),(uint)((byte)puVar1[7] & 0x7f),SLOT_BUFFER,&ctx);
    iVar3 = mpp_buffer_get_fd_with_caller(ctx,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0x21c) = iVar3;
    iVar3 = mpp_buffer_get_fd_with_caller
                      (*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0xf4) = iVar3;
    *(uint *)(lVar2 + 0xd0) = *(uint *)(lVar2 + 0xd0) & 0xfffe00ff;
    *(uint *)(lVar2 + 0xd0) = *(uint *)(lVar2 + 0xd0) & 0xffffff00;
    *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffffffb;
    *(uint *)(lVar2 + 200) = *(uint *)(lVar2 + 200) & 0xfffffeff | 0x100;
    *(uint *)(lVar2 + 0xcc) = *(uint *)(lVar2 + 0xcc) & 0xff000000 | *puVar1 & 0xffffff;
    *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0x3ffffff | puVar1[1] << 0x1a;
    *(uint *)(lVar2 + 0xe4) = *(uint *)(lVar2 + 0xe4) & 0xfffffffe | 1;
    if ((m2vh_debug & 2) != 0) {
      for (p_reg._4_4_ = 0x32; p_reg._4_4_ < 0x9f; p_reg._4_4_ = p_reg._4_4_ + 1) {
        _mpp_log_l(4,"hal_m2vd_vdpu2","reg[%d] = 0x%08x",(char *)0x0,(ulong)p_reg._4_4_,
                   (ulong)*(uint *)(lVar2 + (ulong)p_reg._4_4_ * 4));
      }
    }
    if (*(long *)((long)hal + 0x98) != 0) {
      _mpp_log_l(4,"hal_m2vd_vdpu2","fwrite regs start",(char *)0x0);
      fprintf(*(FILE **)((long)hal + 0x98),"Frame #%d\n",(ulong)*(uint *)((long)hal + 0x80));
      for (p_reg_1._4_4_ = 0; (int)p_reg_1._4_4_ < 0x9f; p_reg_1._4_4_ = p_reg_1._4_4_ + 1) {
        fprintf(*(FILE **)((long)hal + 0x98),"[(D)%03d, (X)%03x]  %08x\n",(ulong)p_reg_1._4_4_,
                (ulong)p_reg_1._4_4_,(ulong)*(uint *)(lVar2 + (long)(int)p_reg_1._4_4_ * 4));
      }
      fflush(*(FILE **)((long)hal + 0x98));
    }
    (pHStack_18->dec).valid = 1;
    *(int *)((long)hal + 0x80) = *(int *)((long)hal + 0x80) + 1;
  }
  return q_table._4_4_;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;

    if (task->dec.valid) {
        void *q_table = NULL;
        MppBuffer streambuf = NULL;
        MppBuffer framebuf = NULL;
        M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
        M2VDDxvaParam *dx = (M2VDDxvaParam *)task->dec.syntax.data;
        M2vdVdpu2Reg *p_regs = ctx->regs;

        task->dec.valid = 0;
        q_table = mpp_buffer_get_ptr(ctx->qp_table);
        memcpy(q_table, dx->qp_tab, M2VD_BUF_SIZE_QPTAB);
        mpp_buffer_sync_end(ctx->qp_table);

        hal_m2vd_vdpu2_init_hwcfg(ctx);

        p_regs->sw136.mv_accuracy_fwd = 1;
        p_regs->sw136.mv_accuracy_bwd = 1;
        if (dx->seq_ext_head_dec_flag) {
            p_regs->sw53.sw_dec_mode = 5;
            p_regs->sw136.fcode_fwd_hor = dx->pic.full_pel_forward_vector;
            p_regs->sw136.fcode_fwd_ver = dx->pic.forward_f_code;
            p_regs->sw136.fcode_bwd_hor = dx->pic.full_pel_backward_vector;
            p_regs->sw136.fcode_bwd_ver = dx->pic.backward_f_code;

        } else {
            p_regs->sw53.sw_dec_mode = 6;
            p_regs->sw136.fcode_fwd_hor = dx->pic.forward_f_code;
            p_regs->sw136.fcode_fwd_ver = dx->pic.forward_f_code;
            p_regs->sw136.fcode_bwd_hor = dx->pic.backward_f_code;
            p_regs->sw136.fcode_bwd_ver = dx->pic.backward_f_code;
            if (dx->pic.full_pel_forward_vector)
                p_regs->sw136.mv_accuracy_fwd = 0;
            if (dx->pic.full_pel_backward_vector)
                p_regs->sw136.mv_accuracy_bwd = 0;
        }

        p_regs->sw120.pic_mb_width = (dx->seq.decode_width + 15) >> 4;
        p_regs->sw120.pic_mb_height_p = (dx->seq.decode_height + 15) >> 4;
        p_regs->sw57.pic_interlace_e = 1 - dx->seq_ext.progressive_sequence;
        if (dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_FRAME)
            p_regs->sw57.pic_fieldmode_e = 0;
        else {
            p_regs->sw57.pic_fieldmode_e = 1;
            p_regs->sw57.pic_topfield_e = dx->pic_code_ext.picture_structure == 1;
        }
        if (dx->pic.picture_coding_type == M2VD_CODING_TYPE_B)
            p_regs->sw57.pic_b_e = 1;
        else
            p_regs->sw57.pic_b_e = 0;
        if (dx->pic.picture_coding_type == M2VD_CODING_TYPE_I)
            p_regs->sw57.pic_inter_e = 0;
        else
            p_regs->sw57.pic_inter_e = 1;

        p_regs->sw120.topfieldfirst_e = dx->pic_code_ext.top_field_first;
        p_regs->sw57.fwd_interlace_e = 0;
        p_regs->sw57.write_mvs_e = 0;//concealment_motion_vectors;
        p_regs->sw120.alt_scan_e = dx->pic_code_ext.alternate_scan;
        p_regs->sw136.alt_scan_flag_e = dx->pic_code_ext.alternate_scan;

        p_regs->sw122.qscale_type = dx->pic_code_ext.q_scale_type;
        p_regs->sw122.intra_dc_prec = dx->pic_code_ext.intra_dc_precision;
        p_regs->sw122.con_mv_e = dx->pic_code_ext.concealment_motion_vectors;
        p_regs->sw122.intra_vlc_tab = dx->pic_code_ext.intra_vlc_format;
        p_regs->sw122.frame_pred_dct = dx->pic_code_ext.frame_pred_frame_dct;
        p_regs->sw51.init_qp = 1;

        mpp_buf_slot_get_prop(ctx->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
        p_regs->sw64.VLC_base = mpp_buffer_get_fd(streambuf);
        if (dx->bitstream_offset) {
            mpp_dev_set_reg_offset(ctx->dev, 64, dx->bitstream_offset);
        }

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);


        if ((dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) ||
            (dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_FRAME)) {
            p_regs->sw63.cur_pic_base = mpp_buffer_get_fd(framebuf); //just index need map
        } else {
            p_regs->sw63.cur_pic_base = mpp_buffer_get_fd(framebuf);
            mpp_dev_set_reg_offset(ctx->dev, 63, MPP_ALIGN(dx->seq.decode_width, 16));
        }

        //ref & qtable config
        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[0].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw131.ref0  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[1].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw148.ref1  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[2].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw134.ref2  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[3].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw135.ref3  = mpp_buffer_get_fd(framebuf); //just index need map

        p_regs->sw61.slice_table = mpp_buffer_get_fd(ctx->qp_table);

        p_regs->sw52.startmb_x = 0;
        p_regs->sw52.startmb_y = 0;
        p_regs->sw57.dec_out_dis = 0;
        p_regs->sw50.filtering_dis = 1;

        p_regs->sw51.stream_len = dx->bitstream_length;
        p_regs->sw122.stream_start_bit = dx->bitstream_start_bit;
        p_regs->sw57.dec_e = 1;

        if (M2VH_DBG_REG & m2vh_debug) {
            RK_U32 j = 0;
            RK_U32 *p_reg = (RK_U32 *)p_regs;
            for (j = 50; j < 159; j++) {
                mpp_log("reg[%d] = 0x%08x", j, p_reg[j]);
            }
        }
        if (ctx->fp_reg_in) {
            int k = 0;
            RK_U32 *p_reg = (RK_U32*)p_regs;
            mpp_log("fwrite regs start");
            fprintf(ctx->fp_reg_in, "Frame #%d\n", ctx->dec_frame_cnt);
            for (k = 0; k < M2VD_VDPU2_REG_NUM; k++)
                fprintf(ctx->fp_reg_in, "[(D)%03d, (X)%03x]  %08x\n", k, k, p_reg[k]);
            fflush(ctx->fp_reg_in);
        }

        task->dec.valid = 1;
        ctx->dec_frame_cnt++;
    }
    return ret;

}